

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFileTests.cc
# Opt level: O3

ValidSchema makeValidSchema(char *schema)

{
  char *in_RSI;
  ValidSchema VVar1;
  ValidSchema vs;
  istringstream iss;
  allocator<char> local_1a9;
  ValidSchema local_1a8;
  long local_198 [2];
  istringstream local_188 [120];
  ios_base local_110 [264];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,in_RSI,&local_1a9);
  std::__cxx11::istringstream::istringstream(local_188,(string *)&local_1a8,_S_in);
  if (local_1a8.root_.px != (element_type *)local_198) {
    operator_delete(local_1a8.root_.px,local_198[0] + 1);
  }
  avro::ValidSchema::ValidSchema(&local_1a8);
  avro::compileJsonSchema((istream *)local_188,&local_1a8);
  *(element_type **)schema = local_1a8.root_.px;
  *(sp_counted_base **)(schema + 8) = local_1a8.root_.pn.pi_;
  if (local_1a8.root_.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_1a8.root_.pn.pi_)->use_count_ = (local_1a8.root_.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  boost::detail::shared_count::~shared_count(&local_1a8.root_.pn);
  std::__cxx11::istringstream::~istringstream(local_188);
  VVar1.root_ = (NodePtr)std::ios_base::~ios_base(local_110);
  return (ValidSchema)VVar1.root_;
}

Assistant:

static ValidSchema makeValidSchema(const char* schema)
{
    istringstream iss(schema);
    ValidSchema vs;
    compileJsonSchema(iss, vs);
    return ValidSchema(vs);
}